

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O2

void json_value_free_ex(json_settings *settings,json_value *value)

{
  json_type jVar1;
  _json_value *p_Var2;
  uint uVar3;
  
  if (value == (json_value *)0x0) {
    return;
  }
  value->parent = (_json_value *)0x0;
  do {
    while( true ) {
      if (value == (json_value *)0x0) {
        return;
      }
      jVar1 = value->type;
      if (jVar1 != json_object) break;
      if ((value->u).boolean == 0) {
LAB_0019decc:
        (*settings->mem_free)((value->u).string.ptr,settings->user_data);
LAB_0019ded7:
        p_Var2 = value->parent;
        (*settings->mem_free)(value,settings->user_data);
        value = p_Var2;
      }
      else {
        uVar3 = (value->u).boolean - 1;
        (value->u).string.length = uVar3;
        value = (value->u).object.values[uVar3].value;
      }
    }
    if (jVar1 == json_string) goto LAB_0019decc;
    if (jVar1 != json_array) goto LAB_0019ded7;
    if ((value->u).boolean == 0) goto LAB_0019decc;
    uVar3 = (value->u).boolean - 1;
    (value->u).string.length = uVar3;
    value = *(json_value **)((value->u).string.ptr + (ulong)uVar3 * 8);
  } while( true );
}

Assistant:

void json_value_free_ex (json_settings * settings, json_value * value)
{
   json_value * cur_value;

   if (!value)
      return;

   value->parent = 0;

   while (value)
   {
      switch (value->type)
      {
         case json_array:

            if (!value->u.array.length)
            {
               settings->mem_free (value->u.array.values, settings->user_data);
               break;
            }

            value = value->u.array.values [-- value->u.array.length];
            continue;

         case json_object:

            if (!value->u.object.length)
            {
               settings->mem_free (value->u.object.values, settings->user_data);
               break;
            }

            value = value->u.object.values [-- value->u.object.length].value;
            continue;

         case json_string:

            settings->mem_free (value->u.string.ptr, settings->user_data);
            break;

         default:
            break;
      };

      cur_value = value;
      value = value->parent;
      settings->mem_free (cur_value, settings->user_data);
   }
}